

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.cpp
# Opt level: O0

void __thiscall sf2cute::RIFFChunk::RIFFChunk(RIFFChunk *this,string *name)

{
  string local_38;
  string *local_18;
  string *name_local;
  RIFFChunk *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  RIFFChunkInterface::RIFFChunkInterface(&this->super_RIFFChunkInterface);
  (this->super_RIFFChunkInterface)._vptr_RIFFChunkInterface = (_func_int **)&PTR__RIFFChunk_00163980
  ;
  std::__cxx11::string::string((string *)&this->name_);
  std::vector<char,_std::allocator<char>_>::vector(&this->data_);
  std::__cxx11::string::string((string *)&local_38,(string *)name);
  set_name(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

RIFFChunk::RIFFChunk(std::string name) {
  set_name(std::move(name));
}